

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O3

void __thiscall TPZOneShapeRestraint::TPZOneShapeRestraint(TPZOneShapeRestraint *this)

{
  pair<long,_int> *ppVar1;
  long lVar2;
  
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore = (pair<long,_int> *)0x0;
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fNElements = 0;
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fNAlloc = 0;
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01900af8;
  lVar2 = 0x28;
  do {
    *(undefined8 *)((long)(this->fFaces).fExtAlloc + lVar2 + -0x28) = 0;
    *(undefined4 *)
     ((long)&(((TPZManVector<std::pair<long,_int>,_4> *)((this->fFaces).fExtAlloc + -2))->
             super_TPZVec<std::pair<long,_int>_>)._vptr_TPZVec + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore = (this->fFaces).fExtAlloc;
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fNElements = 4;
  (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fNAlloc = 0;
  TPZVec<int>::TPZVec(&(this->fOrient).super_TPZVec<int>,0);
  (this->fOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
  (this->fOrient).super_TPZVec<int>.fStore = (this->fOrient).fExtAlloc;
  (this->fOrient).super_TPZVec<int>.fNElements = 4;
  (this->fOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fOrient).fExtAlloc[0] = -1;
  (this->fOrient).fExtAlloc[1] = -1;
  (this->fOrient).fExtAlloc[2] = -1;
  (this->fOrient).fExtAlloc[3] = -1;
  ppVar1 = (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore;
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&ppVar1->first + lVar2) = 0xffffffffffffffff;
    *(undefined4 *)((long)&ppVar1->second + lVar2) = 0xffffffff;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

TPZOneShapeRestraint() : fFaces(4), fOrient(4,-1)
    {
        for(int i=0; i<4; i++)
        {
            fFaces[i] = std::make_pair<int64_t,int>(-1, -1);
        }
    }